

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O2

Vec_Wec_t * Gia_Iso2ManCheckIsoClasses(Gia_Man_t *p,Vec_Wec_t *vEquivs)

{
  int *piVar1;
  int Entry;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Vec_Int_t *p_03;
  Vec_Int_t *p_04;
  Vec_Int_t *p_05;
  Vec_Wec_t *p_06;
  Vec_Int_t *pVVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  uint i;
  ulong uVar5;
  int i_00;
  
  p_00 = Vec_IntAlloc(10000);
  p_01 = Vec_IntAlloc(10000);
  p_02 = Vec_IntAlloc(10000);
  p_03 = Vec_IntStart(p->nObjs);
  p_04 = Vec_IntStart(p->nObjs);
  p_05 = Vec_IntAlloc(100);
  p_06 = Vec_WecAlloc(vEquivs->nSize * 2);
  uVar5 = 0;
  for (i = 0; (int)i < vEquivs->nSize; i = i + 1) {
    pVVar2 = Vec_WecEntry(vEquivs,i);
    if (i % 0x32 == 0) {
      printf("Finished %8d outputs (out of %8d)...\r",uVar5,(ulong)(uint)(p->vCos->nSize - p->nRegs)
            );
      fflush(_stdout);
    }
    Gia_Iso2ManCheckIsoClassOne(p,pVVar2,p_00,p_01,p_02,p_03,p_04,p_05);
    uVar5 = (ulong)(uint)((int)uVar5 + pVVar2->nSize);
    pVVar3 = Vec_WecPushLevel(p_06);
    iVar4 = pVVar2->nSize;
    piVar1 = pVVar2->pArray;
    pVVar3->nCap = pVVar2->nCap;
    pVVar3->nSize = iVar4;
    pVVar3->pArray = piVar1;
    pVVar2->nCap = 0;
    pVVar2->nSize = 0;
    pVVar2->pArray = (int *)0x0;
    iVar4 = p_05->nSize;
    if (iVar4 != 0) {
      pVVar2 = Vec_WecPushLevel(vEquivs);
      i_00 = 0;
      if (iVar4 < 1) {
        iVar4 = i_00;
      }
      for (; iVar4 != i_00; i_00 = i_00 + 1) {
        Entry = Vec_IntEntry(p_05,i_00);
        Vec_IntPush(pVVar2,Entry);
      }
    }
  }
  Vec_IntFree(p_05);
  Vec_IntFree(p_00);
  Vec_IntFree(p_01);
  Vec_IntFree(p_02);
  Vec_IntFree(p_03);
  Vec_IntFree(p_04);
  return p_06;
}

Assistant:

Vec_Wec_t * Gia_Iso2ManCheckIsoClasses( Gia_Man_t * p, Vec_Wec_t * vEquivs )
{
    Vec_Wec_t * vEquivs2;
    Vec_Int_t * vRoots = Vec_IntAlloc( 10000 );
    Vec_Int_t * vVec0 = Vec_IntAlloc( 10000 );
    Vec_Int_t * vVec1 = Vec_IntAlloc( 10000 );
    Vec_Int_t * vMap0 = Vec_IntStart( Gia_ManObjNum(p) );
    Vec_Int_t * vMap1 = Vec_IntStart( Gia_ManObjNum(p) );
    Vec_Int_t * vClass, * vClass2, * vNewClass;
    int i, Counter = 0;
    vNewClass = Vec_IntAlloc( 100 );
    vEquivs2 = Vec_WecAlloc( 2 * Vec_WecSize(vEquivs) );
    Vec_WecForEachLevel( vEquivs, vClass, i )
    {
        if ( i % 50 == 0 )
            printf( "Finished %8d outputs (out of %8d)...\r", Counter, Gia_ManPoNum(p) ), fflush(stdout);
        // split this class
        Gia_Iso2ManCheckIsoClassOne( p, vClass, vRoots, vVec0, vVec1, vMap0, vMap1, vNewClass );
        Counter += Vec_IntSize(vClass);
        // add remaining class
        vClass2 = Vec_WecPushLevel( vEquivs2 );
        *vClass2 = *vClass;
        vClass->pArray = NULL;
        vClass->nSize = vClass->nCap = 0;
        // add new class
        if ( Vec_IntSize(vNewClass) == 0 )
            continue;
        vClass = Vec_WecPushLevel( vEquivs );
        Vec_IntAppend( vClass, vNewClass );
    }
    Vec_IntFree( vNewClass );   
    Vec_IntFree( vRoots );
    Vec_IntFree( vVec0 );
    Vec_IntFree( vVec1 );
    Vec_IntFree( vMap0 );
    Vec_IntFree( vMap1 );
    return vEquivs2;
}